

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

AddrInfo * __thiscall AddrManImpl::Find(AddrManImpl *this,CService *addr,nid_type *pnId)

{
  long lVar1;
  iterator iVar2;
  iterator iVar3;
  AddrInfo *pAVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = std::
          _Hashtable<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->mapAddr)._M_h,addr);
  if (iVar2.super__Node_iterator_base<std::pair<const_CService,_long>,_false>._M_cur ==
      (__node_type *)0x0) {
    pAVar4 = (AddrInfo *)0x0;
  }
  else {
    if (pnId != (nid_type *)0x0) {
      *pnId = *(nid_type *)
               ((long)iVar2.super__Node_iterator_base<std::pair<const_CService,_long>,_false>._M_cur
               + 0x30);
    }
    iVar3 = std::
            _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->mapInfo)._M_h,
                   (key_type_conflict *)
                   ((long)iVar2.super__Node_iterator_base<std::pair<const_CService,_long>,_false>.
                          _M_cur + 0x30));
    pAVar4 = (AddrInfo *)
             ((long)iVar3.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur +
             0x10);
    if (iVar3.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur ==
        (__node_type *)0x0) {
      pAVar4 = (AddrInfo *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pAVar4;
}

Assistant:

AddrInfo* AddrManImpl::Find(const CService& addr, nid_type* pnId)
{
    AssertLockHeld(cs);

    const auto it = mapAddr.find(addr);
    if (it == mapAddr.end())
        return nullptr;
    if (pnId)
        *pnId = (*it).second;
    const auto it2 = mapInfo.find((*it).second);
    if (it2 != mapInfo.end())
        return &(*it2).second;
    return nullptr;
}